

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  Fad<double> *pFVar6;
  FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar7;
  Fad<double> *pFVar8;
  Fad<double> *pFVar9;
  double dVar10;
  double dVar11;
  
  pFVar3 = (this->left_->fadexpr_).left_;
  pFVar4 = (this->left_->fadexpr_).right_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  dVar1 = (pFVar3->fadexpr_).left_.constant_;
  pFVar6 = (pFVar4->fadexpr_).right_;
  dVar11 = (pFVar4->fadexpr_).left_.constant_ + pFVar6->val_;
  dVar10 = dVar1 * pFVar5->val_;
  pFVar7 = (this->right_->fadexpr_).left_;
  pFVar3 = (pFVar7->fadexpr_).right_;
  dVar2 = (pFVar3->fadexpr_).left_.constant_;
  pFVar8 = (pFVar3->fadexpr_).right_;
  pFVar9 = (this->right_->fadexpr_).right_;
  return dVar10 * dVar11 * ((pFVar9->dx_).ptr_to_data[i] - dVar2 * (pFVar8->dx_).ptr_to_data[i]) +
         (((pFVar7->fadexpr_).left_.constant_ - pFVar8->val_ * dVar2) + pFVar9->val_) *
         ((pFVar5->dx_).ptr_to_data[i] * dVar1 * dVar11 + (pFVar6->dx_).ptr_to_data[i] * dVar10);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}